

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O0

bool libwebm::CopyPrimaryChromaticity
               (PrimaryChromaticity *parser_pc,PrimaryChromaticityPtr *muxer_pc)

{
  PrimaryChromaticity *this;
  pointer local_40;
  PrimaryChromaticityPtr *muxer_pc_local;
  PrimaryChromaticity *parser_pc_local;
  
  this = (PrimaryChromaticity *)operator_new(8,(nothrow_t *)&std::nothrow);
  local_40 = (pointer)0x0;
  if (this != (PrimaryChromaticity *)0x0) {
    mkvmuxer::PrimaryChromaticity::PrimaryChromaticity(this,parser_pc->x,parser_pc->y);
    local_40 = this;
  }
  std::
  unique_ptr<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>::
  reset(muxer_pc,local_40);
  return muxer_pc != (PrimaryChromaticityPtr *)0x0;
}

Assistant:

bool CopyPrimaryChromaticity(const mkvparser::PrimaryChromaticity& parser_pc,
                             PrimaryChromaticityPtr* muxer_pc) {
  muxer_pc->reset(new (std::nothrow)
                      mkvmuxer::PrimaryChromaticity(parser_pc.x, parser_pc.y));
  if (!muxer_pc)
    return false;
  return true;
}